

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsgVariableManager.cpp
# Opt level: O1

void __thiscall
rsg::VariableManager::setValue(VariableManager *this,Variable *variable,ConstValueRangeAccess value)

{
  pointer *pppVVar1;
  ValueScope *this_00;
  iterator __position;
  __normal_iterator<rsg::ValueEntry_*const_*,_std::vector<rsg::ValueEntry_*,_std::allocator<rsg::ValueEntry_*>_>_>
  _Var2;
  __normal_iterator<const_rsg::ValueEntry_**,_std::vector<const_rsg::ValueEntry_*,_std::allocator<const_rsg::ValueEntry_*>_>_>
  _Var3;
  ValueEntry *local_30;
  Variable *local_28;
  
  this_00 = (this->m_valueScopeStack).
            super__Vector_base<rsg::ValueScope_*,_std::allocator<rsg::ValueScope_*>_>._M_impl.
            super__Vector_impl_data._M_finish[-1];
  local_30 = (ValueEntry *)variable;
  _Var2 = std::
          __find_if<__gnu_cxx::__normal_iterator<rsg::ValueEntry*const*,std::vector<rsg::ValueEntry*,std::allocator<rsg::ValueEntry*>>>,__gnu_cxx::__ops::_Iter_equals_val<rsg::CompareEntryVariable_const>>
                    ((this_00->m_entries).
                     super__Vector_base<rsg::ValueEntry_*,_std::allocator<rsg::ValueEntry_*>_>.
                     _M_impl.super__Vector_impl_data._M_start,
                     (this_00->m_entries).
                     super__Vector_base<rsg::ValueEntry_*,_std::allocator<rsg::ValueEntry_*>_>.
                     _M_impl.super__Vector_impl_data._M_finish);
  if ((_Var2._M_current ==
       (this_00->m_entries).
       super__Vector_base<rsg::ValueEntry_*,_std::allocator<rsg::ValueEntry_*>_>._M_impl.
       super__Vector_impl_data._M_finish) || (*_Var2._M_current == (ValueEntry *)0x0)) {
    local_30 = ValueScope::allocate(this_00,variable);
    local_28 = variable;
    _Var3 = std::
            __find_if<__gnu_cxx::__normal_iterator<rsg::ValueEntry_const**,std::vector<rsg::ValueEntry_const*,std::allocator<rsg::ValueEntry_const*>>>,__gnu_cxx::__ops::_Iter_equals_val<rsg::CompareEntryVariable_const>>
                      ((this->m_entryCache).
                       super__Vector_base<const_rsg::ValueEntry_*,_std::allocator<const_rsg::ValueEntry_*>_>
                       ._M_impl.super__Vector_impl_data._M_start,
                       (this->m_entryCache).
                       super__Vector_base<const_rsg::ValueEntry_*,_std::allocator<const_rsg::ValueEntry_*>_>
                       ._M_impl.super__Vector_impl_data._M_finish);
    __position._M_current =
         (this->m_entryCache).
         super__Vector_base<const_rsg::ValueEntry_*,_std::allocator<const_rsg::ValueEntry_*>_>.
         _M_impl.super__Vector_impl_data._M_finish;
    if (_Var3._M_current == __position._M_current) {
      if (__position._M_current ==
          (this->m_entryCache).
          super__Vector_base<const_rsg::ValueEntry_*,_std::allocator<const_rsg::ValueEntry_*>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::vector<rsg::ValueEntry_const*,std::allocator<rsg::ValueEntry_const*>>::
        _M_realloc_insert<rsg::ValueEntry_const*const&>
                  ((vector<rsg::ValueEntry_const*,std::allocator<rsg::ValueEntry_const*>> *)
                   &this->m_entryCache,__position,&local_30);
      }
      else {
        *__position._M_current = local_30;
        pppVVar1 = &(this->m_entryCache).
                    super__Vector_base<const_rsg::ValueEntry_*,_std::allocator<const_rsg::ValueEntry_*>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
        *pppVVar1 = *pppVVar1 + 1;
      }
    }
    else {
      *_Var3._M_current = local_30;
    }
  }
  ValueScope::setValue(this_00,variable,value);
  return;
}

Assistant:

void VariableManager::setValue (const Variable* variable, ConstValueRangeAccess value)
{
	ValueScope& curScope = getCurValueScope();

	if (!curScope.findEntry(variable))
	{
		// New value, allocate and update cache.
		ValueEntry*									newEntry	= curScope.allocate(variable);
		std::vector<const ValueEntry*>::iterator	cachePos	= std::find(m_entryCache.begin(), m_entryCache.end(), CompareEntryVariable(variable));

		if (cachePos != m_entryCache.end())
			*cachePos = newEntry;
		else
			m_entryCache.push_back(newEntry);
	}

	curScope.setValue(variable, value);
}